

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_aggregate_functions.cpp
# Opt level: O3

void RepeatedStringAggFinalize
               (duckdb_function_info info,duckdb_aggregate_state *source_p,duckdb_vector result,
               idx_t count,idx_t offset)

{
  long lVar1;
  undefined8 uVar2;
  idx_t iVar3;
  
  duckdb_vector_ensure_validity_writable(result);
  uVar2 = duckdb_vector_get_validity(result);
  if (count != 0) {
    iVar3 = 0;
    do {
      lVar1 = *(long *)source_p[iVar3];
      if (lVar1 == 0) {
        duckdb_validity_set_row_invalid(uVar2,offset + iVar3);
      }
      else {
        duckdb_vector_assign_string_element_len
                  (result,offset + iVar3,lVar1,*(long *)(source_p[iVar3] + 8));
      }
      iVar3 = iVar3 + 1;
    } while (count != iVar3);
  }
  return;
}

Assistant:

void RepeatedStringAggFinalize(duckdb_function_info info, duckdb_aggregate_state *source_p, duckdb_vector result,
                               idx_t count, idx_t offset) {
	auto source = reinterpret_cast<RepeatedStringAggState **>(source_p);
	duckdb_vector_ensure_validity_writable(result);
	auto result_validity = duckdb_vector_get_validity(result);

	for (idx_t i = 0; i < count; i++) {
		if (!source[i]->data) {
			duckdb_validity_set_row_invalid(result_validity, offset + i);
		} else {
			duckdb_vector_assign_string_element_len(result, offset + i, reinterpret_cast<const char *>(source[i]->data),
			                                        source[i]->size);
		}
	}
}